

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Framebuffer::Framebuffer
          (Framebuffer *this,Context *context,FboConfig *config,int width,int height,deUint32 fbo,
          deUint32 colorBufferName,deUint32 depthStencilBufferName)

{
  GLenum GVar1;
  int iVar2;
  deUint32 dVar3;
  TestError *pTVar4;
  Error *this_00;
  char *message;
  Enum<int,_2UL> EVar5;
  GetNameFunc local_80;
  int local_78;
  string local_70;
  int local_4c;
  undefined4 local_48;
  GLenum err;
  deUint32 point;
  deUint32 bit;
  int ndx;
  deUint32 local_2c;
  int local_28;
  deUint32 fbo_local;
  int height_local;
  int width_local;
  FboConfig *config_local;
  Context *context_local;
  Framebuffer *this_local;
  
  GVar1 = config->colorType;
  (this->m_config).buffers = config->buffers;
  (this->m_config).colorType = GVar1;
  GVar1 = config->depthStencilType;
  (this->m_config).colorFormat = config->colorFormat;
  (this->m_config).depthStencilType = GVar1;
  iVar2 = config->width;
  (this->m_config).depthStencilFormat = config->depthStencilFormat;
  (this->m_config).width = iVar2;
  iVar2 = config->samples;
  (this->m_config).height = config->height;
  (this->m_config).samples = iVar2;
  this->m_context = context;
  this->m_framebuffer = fbo;
  this->m_colorBuffer = 0;
  this->m_depthStencilBuffer = 0;
  local_2c = fbo;
  local_28 = height;
  fbo_local = width;
  _height_local = config;
  config_local = (FboConfig *)context;
  context_local = (Context *)this;
  checkColorFormatSupport(context,config->colorFormat);
  if (this->m_framebuffer == 0) {
    (**(code **)(*(long *)config_local + 0x50))(config_local,1,&this->m_framebuffer);
  }
  (**(code **)(*(long *)config_local + 0x48))(config_local,0x8d40,this->m_framebuffer);
  if (((this->m_config).buffers & 0x4000) != 0) {
    GVar1 = (this->m_config).colorType;
    if (GVar1 == 0xde1) {
      dVar3 = createTex2D(this,colorBufferName,(this->m_config).colorFormat,fbo_local,local_28);
      this->m_colorBuffer = dVar3;
      (**(code **)(*(long *)config_local + 0xf0))
                (config_local,0x8d40,0x8ce0,0xde1,this->m_colorBuffer,0);
    }
    else {
      if (GVar1 != 0x8d41) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Unsupported type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                   ,0x116);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = createRbo(this,colorBufferName,(this->m_config).colorFormat,fbo_local,local_28);
      this->m_colorBuffer = dVar3;
      (**(code **)(*(long *)config_local + 0x100))
                (config_local,0x8d40,0x8ce0,0x8d41,this->m_colorBuffer);
    }
  }
  if (((this->m_config).buffers & 0x500) != 0) {
    GVar1 = (this->m_config).depthStencilType;
    if (GVar1 == 0xde1) {
      dVar3 = createTex2D(this,depthStencilBufferName,(this->m_config).depthStencilFormat,fbo_local,
                          local_28);
      this->m_depthStencilBuffer = dVar3;
    }
    else {
      if (GVar1 != 0x8d41) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Unsupported type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                   ,0x121);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = createRbo(this,depthStencilBufferName,(this->m_config).depthStencilFormat,fbo_local,
                        local_28);
      this->m_depthStencilBuffer = dVar3;
    }
  }
  for (point = 0; (int)point < 2; point = point + 1) {
    err = 0x100;
    if (point != 0) {
      err = 0x400;
    }
    local_48 = 0x8d00;
    if (point != 0) {
      local_48 = 0x8d20;
    }
    if (((this->m_config).buffers & err) != 0) {
      GVar1 = (this->m_config).depthStencilType;
      if (GVar1 == 0xde1) {
        (**(code **)(*(long *)config_local + 0xf0))
                  (config_local,0x8d40,local_48,0xde1,this->m_depthStencilBuffer,0);
      }
      else if (GVar1 == 0x8d41) {
        (**(code **)(*(long *)config_local + 0x100))
                  (config_local,0x8d40,local_48,0x8d41,this->m_depthStencilBuffer);
      }
    }
  }
  local_4c = (*this->m_context->_vptr_Context[0x79])();
  if (local_4c == 0) {
    (**(code **)(*(long *)config_local + 0x48))(config_local,0x8d40,0);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x38);
  iVar2 = local_4c;
  EVar5 = glu::getErrorStr(local_4c);
  local_80 = EVar5.m_getName;
  local_78 = EVar5.m_value;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_80);
  message = (char *)std::__cxx11::string::c_str();
  glu::Error::Error(this_00,iVar2,message,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                    ,0x138);
  __cxa_throw(this_00,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

Framebuffer::Framebuffer (sglr::Context& context, const FboConfig& config, int width, int height, deUint32 fbo, deUint32 colorBufferName, deUint32 depthStencilBufferName)
	: m_config				(config)
	, m_context				(context)
	, m_framebuffer			(fbo)
	, m_colorBuffer			(0)
	, m_depthStencilBuffer	(0)
{
	// Verify that color format is supported
	checkColorFormatSupport(context, config.colorFormat);

	if (m_framebuffer == 0)
		context.genFramebuffers(1, &m_framebuffer);
	context.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	if (m_config.buffers & (GL_COLOR_BUFFER_BIT))
	{
		switch (m_config.colorType)
		{
			case GL_TEXTURE_2D:
				m_colorBuffer = createTex2D(colorBufferName, m_config.colorFormat, width, height);
				context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_colorBuffer, 0);
				break;

			case GL_RENDERBUFFER:
				m_colorBuffer = createRbo(colorBufferName, m_config.colorFormat, width, height);
				context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorBuffer);
				break;

			default:
				TCU_FAIL("Unsupported type");
		}
	}

	if (m_config.buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))
	{
		switch (m_config.depthStencilType)
		{
			case GL_TEXTURE_2D:		m_depthStencilBuffer = createTex2D(depthStencilBufferName, m_config.depthStencilFormat, width, height);		break;
			case GL_RENDERBUFFER:	m_depthStencilBuffer = createRbo(depthStencilBufferName, m_config.depthStencilFormat, width, height);		break;
			default:
				TCU_FAIL("Unsupported type");
		}
	}

	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx ? GL_STENCIL_BUFFER_BIT : GL_DEPTH_BUFFER_BIT;
		deUint32	point	= ndx ? GL_STENCIL_ATTACHMENT : GL_DEPTH_ATTACHMENT;

		if ((m_config.buffers & bit) == 0)
			continue; /* Not used. */

		switch (m_config.depthStencilType)
		{
			case GL_TEXTURE_2D:		context.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, m_depthStencilBuffer, 0);	break;
			case GL_RENDERBUFFER:	context.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, m_depthStencilBuffer);	break;
			default:
				DE_ASSERT(false);
		}
	}

	GLenum err = m_context.getError();
	if (err != GL_NO_ERROR)
		throw glu::Error(err, glu::getErrorStr(err).toString().c_str(), "", __FILE__, __LINE__);

	context.bindFramebuffer(GL_FRAMEBUFFER, 0);
}